

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O2

Status * __thiscall
draco::PointCloudEncoder::Encode
          (Status *__return_storage_ptr__,PointCloudEncoder *this,EncoderOptions *options,
          EncoderBuffer *out_buffer)

{
  string *this_00;
  pointer piVar1;
  bool bVar2;
  int iVar3;
  allocator<char> local_49;
  string local_48;
  
  this->options_ = options;
  this->buffer_ = out_buffer;
  std::
  vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
  ::clear(&this->attributes_encoders_);
  piVar1 = (this->attribute_to_encoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->attribute_to_encoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->attribute_to_encoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->attributes_encoder_ids_order_).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->attributes_encoder_ids_order_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->attributes_encoder_ids_order_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  if (this->point_cloud_ == (PointCloud *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Invalid input geometry.",&local_49);
    __return_storage_ptr__->code_ = DRACO_ERROR;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&local_48);
  }
  else {
    EncodeHeader(__return_storage_ptr__,this);
    if (__return_storage_ptr__->code_ != OK) {
      return __return_storage_ptr__;
    }
    this_00 = &__return_storage_ptr__->error_msg_;
    std::__cxx11::string::~string((string *)this_00);
    EncodeMetadata(__return_storage_ptr__,this);
    if (__return_storage_ptr__->code_ != OK) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
    iVar3 = (*this->_vptr_PointCloudEncoder[4])(this);
    if ((char)iVar3 == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Failed to initialize encoder.",&local_49);
      __return_storage_ptr__->code_ = DRACO_ERROR;
      std::__cxx11::string::string((string *)this_00,(string *)&local_48);
    }
    else {
      iVar3 = (*this->_vptr_PointCloudEncoder[5])(this);
      if ((char)iVar3 == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"Failed to encode internal data.",&local_49);
        __return_storage_ptr__->code_ = DRACO_ERROR;
        std::__cxx11::string::string((string *)this_00,(string *)&local_48);
      }
      else {
        (*this->_vptr_PointCloudEncoder[6])(__return_storage_ptr__,this);
        if (__return_storage_ptr__->code_ != OK) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
        iVar3 = (*this->_vptr_PointCloudEncoder[7])(this);
        if ((char)iVar3 != '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_48,"store_number_of_encoded_points",&local_49);
          bVar2 = Options::GetBool((Options *)options,&local_48,false);
          std::__cxx11::string::~string((string *)&local_48);
          if (bVar2) {
            (*this->_vptr_PointCloudEncoder[0xc])(this);
          }
          __return_storage_ptr__->code_ = OK;
          (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->error_msg_).field_2;
          (__return_storage_ptr__->error_msg_)._M_string_length = 0;
          (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
          return __return_storage_ptr__;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"Failed to encode point attributes.",&local_49);
        __return_storage_ptr__->code_ = DRACO_ERROR;
        std::__cxx11::string::string((string *)this_00,(string *)&local_48);
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudEncoder::Encode(const EncoderOptions &options,
                                 EncoderBuffer *out_buffer) {
  options_ = &options;
  buffer_ = out_buffer;

  // Cleanup from previous runs.
  attributes_encoders_.clear();
  attribute_to_encoder_map_.clear();
  attributes_encoder_ids_order_.clear();

  if (!point_cloud_) {
    return Status(Status::DRACO_ERROR, "Invalid input geometry.");
  }
  DRACO_RETURN_IF_ERROR(EncodeHeader())
  DRACO_RETURN_IF_ERROR(EncodeMetadata())
  if (!InitializeEncoder()) {
    return Status(Status::DRACO_ERROR, "Failed to initialize encoder.");
  }
  if (!EncodeEncoderData()) {
    return Status(Status::DRACO_ERROR, "Failed to encode internal data.");
  }
  DRACO_RETURN_IF_ERROR(EncodeGeometryData());
  if (!EncodePointAttributes()) {
    return Status(Status::DRACO_ERROR, "Failed to encode point attributes.");
  }
  if (options.GetGlobalBool("store_number_of_encoded_points", false)) {
    ComputeNumberOfEncodedPoints();
  }
  return OkStatus();
}